

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_socket.cpp
# Opt level: O2

void test_async_send_recv(void)

{
  ostream *poVar1;
  runtime_error *this;
  io_service srv;
  async_writer wrt;
  allocator_type local_268 [32];
  vector<char,_std::allocator<char>_> out;
  vector<char,_std::allocator<char>_> in;
  stream_socket s2;
  stream_socket s1;
  async_reader rdr;
  ostringstream oss;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Test async send/recv");
  std::endl<char,std::char_traits<char>>(poVar1);
  booster::aio::io_service::io_service(&srv);
  booster::aio::stream_socket::stream_socket(&s1,&srv);
  booster::aio::stream_socket::stream_socket(&s2,&srv);
  calls_no = 1;
  the_service = &srv;
  make_pair(&s1,&s2);
  oss = (ostringstream)0x0;
  std::vector<char,_std::allocator<char>_>::vector(&in,0x97,(value_type *)&oss,local_268);
  oss = (ostringstream)0x0;
  std::vector<char,_std::allocator<char>_>::vector(&out,0xbe,(value_type *)&oss,local_268);
  rdr.counter = 0;
  wrt.counter = 0;
  wrt.sock = &s2;
  wrt.buf = &out;
  rdr.sock = &s1;
  rdr.buf = &in;
  async_reader::run(&rdr);
  async_writer::run(&wrt);
  booster::aio::io_service::run();
  if (calls_no == 6) {
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&out.super__Vector_base<char,_std::allocator<char>_>);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&in.super__Vector_base<char,_std::allocator<char>_>);
    booster::aio::stream_socket::~stream_socket(&s2);
    booster::aio::stream_socket::~stream_socket(&s1);
    booster::aio::io_service::~io_service(&srv);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::operator<<((ostream *)&oss,"Error ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1bd);
  std::operator<<(poVar1," calls_no == 6");
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,(string *)local_268);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_async_send_recv()
{
	std::cout << "Test async send/recv" << std::endl;
	io::io_service srv;
	io::stream_socket s1(srv),s2(srv);
	reset_glb(srv);
	make_pair(s1,s2);
	std::vector<char> in(151,0),out(190,0);
	async_reader rdr = { 0, &s1, &in };
	async_writer wrt = { 0, &s2, &out };
	rdr.run();
	wrt.run();
	srv.run();
	TEST(calls_no == 6);
}